

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TransformFeedbackBufferBindingCase::testTransformFeedback
          (TransformFeedbackBufferBindingCase *this)

{
  GLuint index;
  TestContext *testCtx;
  int *piVar1;
  undefined1 local_3c [8];
  StateQueryMemoryWriteGuard<int> boundBuffer;
  int ndx_1;
  int ndx;
  GLuint feedbackBuffers [2];
  int feedbackIndex [2];
  int feedbackOutputIndex;
  int feedbackPositionIndex;
  TransformFeedbackBufferBindingCase *this_local;
  
  feedbackBuffers[0] = 0;
  feedbackBuffers[1] = 1;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_TransformFeedbackCase).super_ApiCase.super_CallLogWrapper,2,
             (GLuint *)&ndx_1);
  ApiCase::expectError((ApiCase *)this,0);
  for (boundBuffer.m_postguard = 0; boundBuffer.m_postguard < 2;
      boundBuffer.m_postguard = boundBuffer.m_postguard + 1) {
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_TransformFeedbackCase).super_ApiCase.super_CallLogWrapper,0x8c8e,
               (&ndx_1)[boundBuffer.m_postguard]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_TransformFeedbackCase).super_ApiCase.super_CallLogWrapper,0x8c8e,0x10,
               (void *)0x0,0x88e9);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_TransformFeedbackCase).super_ApiCase.super_CallLogWrapper,0x8c8e,
               feedbackBuffers[boundBuffer.m_postguard],(&ndx_1)[boundBuffer.m_postguard]);
    ApiCase::expectError((ApiCase *)this,0);
  }
  for (boundBuffer.m_value = 0; boundBuffer.m_value < 2;
      boundBuffer.m_value = boundBuffer.m_value + 1) {
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_3c);
    index = feedbackBuffers[boundBuffer.m_value];
    piVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                       ((StateQueryMemoryWriteGuard<int> *)local_3c);
    glu::CallLogWrapper::glGetIntegeri_v
              (&(this->super_TransformFeedbackCase).super_ApiCase.super_CallLogWrapper,0x8c8f,index,
               piVar1);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
              ((StateQueryMemoryWriteGuard<int> *)local_3c,
               (this->super_TransformFeedbackCase).super_ApiCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx);
    testCtx = (this->super_TransformFeedbackCase).super_ApiCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    piVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_3c);
    checkIntEquals(testCtx,*piVar1,(&ndx_1)[boundBuffer.m_value]);
  }
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_TransformFeedbackCase).super_ApiCase.super_CallLogWrapper,2,
             (GLuint *)&ndx_1);
  return;
}

Assistant:

void testTransformFeedback (void)
	{
		const int feedbackPositionIndex = 0;
		const int feedbackOutputIndex = 1;
		const int feedbackIndex[2] = {feedbackPositionIndex, feedbackOutputIndex};

		// bind bffers

		GLuint feedbackBuffers[2];
		glGenBuffers(2, feedbackBuffers);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, feedbackBuffers[ndx]);
			glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, NULL, GL_DYNAMIC_READ);
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, feedbackIndex[ndx], feedbackBuffers[ndx]);
			expectError(GL_NO_ERROR);
		}

		// test TRANSFORM_FEEDBACK_BUFFER_BINDING

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			StateQueryMemoryWriteGuard<GLint> boundBuffer;
			glGetIntegeri_v(GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, feedbackIndex[ndx], &boundBuffer);
			boundBuffer.verifyValidity(m_testCtx);
			checkIntEquals(m_testCtx, boundBuffer, feedbackBuffers[ndx]);
		}


		// cleanup

		glDeleteBuffers(2, feedbackBuffers);
	}